

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O1

void olsrv2_lan_remove(nhdp_domain *domain,os_route_key *prefix)

{
  avl_node *node;
  long lVar1;
  
  node = avl_find(&_lan_tree,prefix);
  if (node != (avl_node *)0x0) {
    *(undefined1 *)((long)&node[1].list.prev + (long)domain->index * 8 + 1) = 0;
    olsrv2_routing_domain_changed(domain,true);
    lVar1 = 0x69;
    while (*(char *)((long)&node[-1].parent + lVar1) == '\0') {
      lVar1 = lVar1 + 8;
      if (lVar1 == 0x89) {
        avl_remove(&_lan_tree,node);
        oonf_class_free(&_lan_class,&node[-1].parent);
        return;
      }
    }
  }
  return;
}

Assistant:

void
olsrv2_lan_remove(struct nhdp_domain *domain, const struct os_route_key *prefix) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (!entry) {
    return;
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->active = false;
  olsrv2_routing_domain_changed(domain, true);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    if (entry->_domaindata[i].active) {
      /* entry is still in use */
      return;
    }
  }
  _remove(entry);
}